

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioReadBlifAig.c
# Opt level: O0

int Io_BlifParseLatch(Io_BlifMan_t *p,char *pLine)

{
  int iVar1;
  uint uVar2;
  char *__s1;
  char *pcVar3;
  void *pvVar4;
  Io_BlifObj_t *pIVar5;
  int local_34;
  int Init;
  char *pToken;
  Io_BlifObj_t *pObj;
  char *pLine_local;
  Io_BlifMan_t *p_local;
  
  Io_BlifSplitIntoTokens(p->vTokens,pLine,'\0');
  __s1 = (char *)Vec_PtrEntry(p->vTokens,0);
  iVar1 = strcmp(__s1,"latch");
  if (iVar1 != 0) {
    __assert_fail("!strcmp(pToken, \"latch\")",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/io/ioReadBlifAig.c"
                  ,0x2c3,"int Io_BlifParseLatch(Io_BlifMan_t *, char *)");
  }
  iVar1 = Vec_PtrSize(p->vTokens);
  if (iVar1 < 3) {
    uVar2 = Io_BlifGetLine(p,__s1);
    sprintf(p->sError,"Line %d: Latch does not have input name and output name.",(ulong)uVar2);
    p_local._4_4_ = 0;
  }
  else {
    iVar1 = Vec_PtrSize(p->vTokens);
    if (iVar1 < 4) {
      local_34 = 2;
    }
    else {
      pcVar3 = (char *)Vec_PtrEntry(p->vTokens,3);
      local_34 = atoi(pcVar3);
    }
    if ((local_34 < 0) || (2 < local_34)) {
      uVar2 = Io_BlifGetLine(p,__s1);
      pvVar4 = Vec_PtrEntry(p->vTokens,3);
      sprintf(p->sError,"Line %d: Initial state of the latch is incorrect (%s).",(ulong)uVar2,pvVar4
             );
      p_local._4_4_ = 0;
    }
    else {
      if (local_34 == 0) {
        local_34 = 1;
      }
      else if (local_34 == 1) {
        local_34 = 2;
      }
      else {
        local_34 = 3;
      }
      pcVar3 = (char *)Vec_PtrEntry(p->vTokens,1);
      pIVar5 = Io_BlifHashFindOrAdd(p,pcVar3);
      *(uint *)pIVar5 = *(uint *)pIVar5 & 0xfffffffb | 4;
      Vec_PtrPush(p->vLis,pIVar5);
      *(uint *)pIVar5 = *(uint *)pIVar5 & 0xffffff3f | local_34 << 6;
      pcVar3 = (char *)Vec_PtrEntry(p->vTokens,2);
      pIVar5 = Io_BlifHashFindOrAdd(p,pcVar3);
      if (((undefined1  [32])*pIVar5 & (undefined1  [32])0x1) == (undefined1  [32])0x0) {
        if ((*(uint *)pIVar5 >> 3 & 1) == 0) {
          *(uint *)pIVar5 = *(uint *)pIVar5 & 0xfffffff7 | 8;
          Vec_PtrPush(p->vLos,pIVar5);
          *(uint *)pIVar5 = *(uint *)pIVar5 & 0xffffff3f | local_34 << 6;
          p_local._4_4_ = 1;
        }
        else {
          uVar2 = Io_BlifGetLine(p,__s1);
          pvVar4 = Vec_PtrEntry(p->vTokens,2);
          sprintf(p->sError,"Line %d: Latch output (%s) is defined as the output of another latch.",
                  (ulong)uVar2,pvVar4);
          p_local._4_4_ = 0;
        }
      }
      else {
        uVar2 = Io_BlifGetLine(p,__s1);
        pvVar4 = Vec_PtrEntry(p->vTokens,2);
        sprintf(p->sError,"Line %d: Primary input (%s) is also defined latch output.",(ulong)uVar2,
                pvVar4);
        p_local._4_4_ = 0;
      }
    }
  }
  return p_local._4_4_;
}

Assistant:

static int Io_BlifParseLatch( Io_BlifMan_t * p, char * pLine )
{
    Io_BlifObj_t * pObj;
    char * pToken;
    int Init;
    Io_BlifSplitIntoTokens( p->vTokens, pLine, '\0' );
    pToken = (char *)Vec_PtrEntry(p->vTokens,0);
    assert( !strcmp(pToken, "latch") );
    if ( Vec_PtrSize(p->vTokens) < 3 )
    {
        sprintf( p->sError, "Line %d: Latch does not have input name and output name.", Io_BlifGetLine(p, pToken) );
        return 0;
    }
    // get initial value
    if ( Vec_PtrSize(p->vTokens) > 3 )
        Init = atoi( (char *)Vec_PtrEntry(p->vTokens,3) );
    else
        Init = 2;
    if ( Init < 0 || Init > 2 )
    {
        sprintf( p->sError, "Line %d: Initial state of the latch is incorrect (%s).", Io_BlifGetLine(p, pToken), (char*)Vec_PtrEntry(p->vTokens,3) );
        return 0;
    }
    if ( Init == 0 )
        Init = IO_BLIF_INIT_ZERO;
    else if ( Init == 1 )
        Init = IO_BLIF_INIT_ONE;
    else // if ( Init == 2 )
        Init = IO_BLIF_INIT_DC;
    // get latch input
    pObj = Io_BlifHashFindOrAdd( p, (char *)Vec_PtrEntry(p->vTokens,1) );
    pObj->fLi = 1;
    Vec_PtrPush( p->vLis, pObj );
    pObj->Init = Init;
    // get latch output
    pObj = Io_BlifHashFindOrAdd( p, (char *)Vec_PtrEntry(p->vTokens,2) );
    if ( pObj->fPi )
    {
        sprintf( p->sError, "Line %d: Primary input (%s) is also defined latch output.", Io_BlifGetLine(p, pToken), (char*)Vec_PtrEntry(p->vTokens,2) );
        return 0;
    }
    if ( pObj->fLo )
    {
        sprintf( p->sError, "Line %d: Latch output (%s) is defined as the output of another latch.", Io_BlifGetLine(p, pToken), (char*)Vec_PtrEntry(p->vTokens,2) );
        return 0;
    }
    pObj->fLo = 1;
    Vec_PtrPush( p->vLos, pObj );
    pObj->Init = Init;
    return 1;
}